

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keywords.cpp
# Opt level: O0

SyntaxKind psy::C::recognize3(char *s,ParseOptions *opts)

{
  ParseOptions *opts_local;
  char *s_local;
  
  if (*s == 'a') {
    if ((s[1] == 's') && (s[2] == 'm')) {
      return KeywordAlias___asm;
    }
  }
  else if (*s == 'f') {
    if ((s[1] == 'o') && (s[2] == 'r')) {
      return Keyword_for;
    }
  }
  else if (((*s == 'i') && (s[1] == 'n')) && (s[2] == 't')) {
    return Keyword_int;
  }
  return IdentifierToken;
}

Assistant:

static inline SyntaxKind recognize3(const char* s, const ParseOptions& opts)
{
    if (s[0] == 'a') {
        if (s[1] == 's') {
            if (s[2] == 'm') {
                return SyntaxKind::KeywordAlias_asm;
            }
        }
    }
    else if (s[0] == 'f') {
        if (s[1] == 'o') {
            if (s[2] == 'r') {
                return SyntaxKind::Keyword_for;
            }
        }
    }
    else if (s[0] == 'i') {
        if (s[1] == 'n') {
            if (s[2] == 't') {
                return SyntaxKind::Keyword_int;
            }
        }
    }
    return SyntaxKind::IdentifierToken;
}